

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall Cholesky_solve_Test::~Cholesky_solve_Test(Cholesky_solve_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Cholesky, solve) {
    Matrix<T, 4, 3> K;
    Matrix<T, 4, 3> P;
    
    // Set S (lower choleksy factor)
    Matrix<T,3,3> S_;
    S_ << 1, 0, 0, 1, 1, 0, 1, 1, 2;
    
    Cholesky<Matrix<T,3,3>> S;
    S.setL(S_);
    
    // Set P
    P << 6, 4, 2, 4, 8, 6, 2, 6, 0, 3, 5, 7;
    
    // Compute K
    K = S.solve(P.transpose()).transpose();

    Matrix<T, 4, 3> P_ = K * S.matrixL().toDenseMatrix() * S.matrixU().toDenseMatrix();
    
    for(int i = 0; i < 4; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            ASSERT_FLOAT_EQ( P(i,j), P_(i,j) );
        }
    }
}